

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerContainer.h
# Opt level: O0

void crampl::
     ContainerContainer<const_std::vector<int,_std::allocator<int>_>,_const_std::vector<double,_std::allocator<double>_>_>
     ::sizeCheck(tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<double,_std::allocator<double>_>_&>
                 *containers)

{
  runtime_error *this;
  bool *in_RCX;
  anon_class_16_2_3baff8e3 func;
  undefined1 local_21 [8];
  bool result;
  optional<unsigned_long> firstSize;
  tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<double,_std::allocator<double>_>_&>
  *containers_local;
  
  firstSize.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = containers;
  std::optional<unsigned_long>::optional((optional<unsigned_long> *)(local_21 + 1));
  local_21[0] = 1;
  func.result = in_RCX;
  func.firstSize = (optional<unsigned_long> *)local_21;
  crampl::detail::
  for_each_in_tuple<crampl::ContainerContainer<std::vector<int,std::allocator<int>>const,std::vector<double,std::allocator<double>>const>::sizeCheck(std::tuple<std::vector<int,std::allocator<int>>const&,std::vector<double,std::allocator<double>>const&>)::_lambda(auto:1_const&)_1_,std::vector<int,std::allocator<int>>const&,std::vector<double,std::allocator<double>>const&>
            ((detail *)containers,
             (tuple<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<double,_std::allocator<double>_>_&>
              *)(local_21 + 1),func);
  if ((local_21[0] & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"invalid container sizes");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void sizeCheck(std::tuple<Containers&...> containers) {
        std::optional<std::size_t> firstSize{};
        bool result = true;
        detail::for_each_in_tuple(containers, [&](const auto &c) {
            if (firstSize)
                result &= *firstSize == c.size();
            else
                firstSize = c.size();
        });
        if (!result)
            throw std::runtime_error("invalid container sizes");
    }